

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O2

void golf_graphics_begin_frame(float dt)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ImGuiIO *pIVar3;
  sg_pass_action action;
  sg_pass_action local_78;
  
  pIVar3 = igGetIO();
  graphics.framerate = pIVar3->Framerate;
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  graphics.window_size = vec2_create((float)wVar1,(float)wVar2);
  local_78.colors[0].value.r = 0.0;
  local_78.colors[0].value.g = 0.0;
  local_78.colors[1].action = _SG_ACTION_DEFAULT;
  local_78.colors[1].value.r = 0.0;
  local_78.colors[3].value.a = 0.0;
  local_78.depth.action = _SG_ACTION_DEFAULT;
  local_78.depth.value = 0.0;
  local_78.stencil.action = _SG_ACTION_DEFAULT;
  local_78.colors[3].action = _SG_ACTION_DEFAULT;
  local_78.colors[3].value.r = 0.0;
  local_78.colors[3].value.g = 0.0;
  local_78.colors[3].value.b = 0.0;
  local_78.stencil.value = '\0';
  local_78.stencil._5_3_ = 0;
  local_78._end_canary = 0;
  local_78.colors[2].value.r = 0.0;
  local_78.colors[2].value.g = 0.0;
  local_78.colors[2].value.b = 0.0;
  local_78.colors[2].value.a = 0.0;
  local_78.colors[1].value.g = 0.0;
  local_78.colors[1].value.b = 0.0;
  local_78.colors[1].value.a = 0.0;
  local_78.colors[2].action = _SG_ACTION_DEFAULT;
  local_78._start_canary = 0;
  local_78.colors[0].action = SG_ACTION_CLEAR;
  local_78.colors[0].value.b = 0.0;
  local_78.colors[0].value.a = 1.0;
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  sg_begin_default_pass(&local_78,wVar1,wVar2);
  sg_end_pass();
  wVar1 = sapp_width();
  wVar2 = sapp_height();
  simgui_new_frame(wVar1,wVar2,(double)dt);
  return;
}

Assistant:

void golf_graphics_begin_frame(float dt) {
    graphics.framerate = igGetIO()->Framerate;
    graphics.window_size = V2((float)sapp_width(), (float)sapp_height());

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0.0f, 0.0f, 0.0f, 1.0f },
        },
    };
    sg_begin_default_pass(&action, sapp_width(), sapp_height());
    sg_end_pass();
    simgui_new_frame(sapp_width(), sapp_height(), dt);
}